

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O2

result<toml::detail::region,_toml::detail::none_t> *
toml::detail::either<toml::detail::character<'\t'>,_toml::detail::in_range<'_',_'~'>_>::invoke
          (result<toml::detail::region,_toml::detail::none_t> *__return_storage_ptr__,location *loc)

{
  result<toml::detail::region,_toml::detail::none_t> *prVar1;
  result<toml::detail::region,_toml::detail::none_t> rslt;
  result<toml::detail::region,_toml::detail::none_t> local_68;
  
  prVar1 = &local_68;
  character<'\t'>::invoke(&local_68,loc);
  if (local_68.is_ok_ == true) {
    result<toml::detail::region,_toml::detail::none_t>::result(__return_storage_ptr__,&local_68);
    loc = (location *)prVar1;
  }
  else {
    in_range<'_',_'~'>::invoke(__return_storage_ptr__,loc);
  }
  result<toml::detail::region,_toml::detail::none_t>::cleanup(&local_68,(EVP_PKEY_CTX *)loc);
  return __return_storage_ptr__;
}

Assistant:

static result<region, none_t>
    invoke(location& loc)
    {
        const auto rslt = Head::invoke(loc);
        if(rslt.is_ok()) {return rslt;}
        return either<Tail...>::invoke(loc);
    }